

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  int iVar1;
  string *psVar2;
  undefined4 extraout_var;
  string dir;
  char local_c2 [2];
  char *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  local_78.View_._M_str = (psVar2->_M_dataplus)._M_p;
  local_78.View_._M_len = psVar2->_M_string_length;
  local_48.View_._M_str = local_48.Digits_;
  local_48.View_._M_len = 1;
  local_48.Digits_[0] = '/';
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xe])(&local_b8,gt->LocalGenerator,gt);
  local_c2[0] = '/';
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x15])(this);
  local_c0 = (char *)CONCAT44(extraout_var,iVar1);
  local_c2[1] = 0x2f;
  cmStrCat<std::__cxx11::string,char,char_const*,char>
            (&local_98,&local_78,&local_48,&local_b8,local_c2,&local_c0,local_c2 + 1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                             '/', gt->LocalGenerator->GetTargetDirectory(gt),
                             '/', this->GetCMakeCFGIntDir(), '/');
  gt->ObjectDirectory = dir;
}